

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorInitializer_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLuint column,GLuint size)

{
  string local_58;
  undefined1 local_21;
  GLuint local_20;
  GLuint local_1c;
  GLuint size_local;
  GLuint column_local;
  InitializerListTest *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = size;
  local_1c = column;
  _size_local = this;
  this_local = (InitializerListTest *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  getVectorValues_abi_cxx11_(&local_58,this,local_1c,local_20);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorInitializer(GLuint column, GLuint size)
{
	std::string result;

	result.append("{");
	result.append(getVectorValues(column, size));
	result.append("}");

	return result;
}